

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

int __thiscall BamTools::ConvertTool::Run(ConvertTool *this,int argc,char **argv)

{
  bool bVar1;
  ConvertToolPrivate *this_00;
  
  Options::Parse(argc,argv,1);
  this_00 = (ConvertToolPrivate *)operator_new(0x130);
  ConvertToolPrivate::ConvertToolPrivate(this_00,this->m_settings);
  this->m_impl = this_00;
  bVar1 = ConvertToolPrivate::Run(this_00);
  return (int)!bVar1;
}

Assistant:

int ConvertTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize ConvertTool with settings
    m_impl = new ConvertToolPrivate(m_settings);

    // run ConvertTool, return success/fail
    if (m_impl->Run()) {
        return 0;
    } else {
        return 1;
    }
}